

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

Aig_Man_t * Saig_SynchSequenceApply(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  undefined1 auVar1 [16];
  int iVar2;
  Vec_Str_t *vSequence;
  void **__ptr;
  void **ppvVar3;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *pAVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  int level;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vSequence = Saig_SynchSequence(pAig,nWords);
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar2 = 0x97c727;
    printf("Design 1: Synchronizing sequence is not found. ");
    if (fVerbose == 0) goto LAB_00671570;
  }
  else {
    if (fVerbose == 0) {
LAB_00671570:
      putchar(10);
      goto LAB_006715a1;
    }
    iVar2 = 0x97c757;
    printf("Design 1: Synchronizing sequence of length %4d is found. ",
           (long)vSequence->nSize / (long)pAig->nTruePis & 0xffffffff,
           (long)vSequence->nSize % (long)pAig->nTruePis & 0xffffffff);
  }
  Abc_Print(iVar2,"%s =","Time");
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
LAB_006715a1:
  if (vSequence == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    pAVar4 = (Aig_Man_t *)0x0;
  }
  else {
    iVar2 = pAig->vObjs->nSize;
    lVar6 = (long)iVar2;
    __ptr = (void **)malloc(lVar6 * 0xc);
    auVar1 = _DAT_008403e0;
    if (0 < lVar6) {
      ppvVar3 = __ptr + lVar6;
      uVar5 = (ulong)(iVar2 + 1U & 0xfffffffe);
      lVar6 = lVar6 + -1;
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      ppvVar8 = __ptr + 1;
      auVar9 = auVar9 ^ _DAT_008403e0;
      auVar10 = _DAT_008403d0;
      do {
        auVar11 = auVar10 ^ auVar1;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          ppvVar8[-1] = ppvVar3;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *ppvVar8 = (void *)((long)ppvVar3 + 4);
        }
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar6 + 2;
        ppvVar8 = ppvVar8 + 2;
        ppvVar3 = ppvVar3 + 1;
        uVar5 = uVar5 - 2;
      } while (uVar5 != 0);
    }
    vSimInfo = (Vec_Ptr_t *)malloc(0x10);
    vSimInfo->nSize = iVar2;
    vSimInfo->nCap = iVar2;
    vSimInfo->pArray = __ptr;
    iVar2 = Saig_SynchSequenceRun(pAig,vSimInfo,vSequence,1);
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x214,"Aig_Man_t *Saig_SynchSequenceApply(Aig_Man_t *, int, int)");
    }
    pAVar4 = Saig_ManDupInitZero(pAig);
    if (__ptr != (void **)0x0) {
      free(__ptr);
    }
    free(vSimInfo);
    if (vSequence->pArray != (char *)0x0) {
      free(vSequence->pArray);
    }
    free(vSequence);
    Aig_ManCleanMarkA(pAig);
  }
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_SynchSequenceApply( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Aig_Man_t * pAigZero;
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;

clk = Abc_Clock();
    // derive synchronization sequence
    vSequence = Saig_SynchSequence( pAig, nWords );
    if ( vSequence == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSequence) / Saig_ManPiNum(pAig) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );
    if ( vSequence == NULL )
    {
        printf( "Quitting synchronization.\n" );
        return NULL;
    }

    // apply synchronization sequence
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), 1 );
    RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
    assert( RetValue == 0 );
    // duplicate 
    pAigZero = Saig_ManDupInitZero( pAig );
    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSequence );
    Aig_ManCleanMarkA( pAig );
    return pAigZero;
}